

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

CURLcode Curl_doh_is_resolved(connectdata *conn,Curl_dns_entry **dnsp)

{
  Curl_easy *data_00;
  char *pcVar1;
  char *pcVar2;
  Curl_addrinfo *addr;
  Curl_dns_entry *pCVar3;
  Curl_addrinfo *ai;
  Curl_dns_entry *dns;
  dohentry de;
  DOHcode rc2;
  DOHcode rc;
  Curl_easy *data;
  Curl_dns_entry **dnsp_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  *dnsp = (Curl_dns_entry *)0x0;
  if (((data_00->req).doh.probe[0].easy == (CURL_conflict *)0x0) &&
     ((data_00->req).doh.probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data_00,"Could not DOH-resolve: %s",(conn->async).hostname);
    conn_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
    if ((*(uint *)&(conn->bits).field_0x4 >> 4 & 1) != 0) {
      conn_local._4_4_ = CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else if ((data_00->req).doh.pending == 0) {
    curl_multi_remove_handle(data_00->multi,(data_00->req).doh.probe[0].easy);
    Curl_close((data_00->req).doh.probe[0].easy);
    curl_multi_remove_handle(data_00->multi,(data_00->req).doh.probe[1].easy);
    Curl_close((data_00->req).doh.probe[1].easy);
    init_dohentry((dohentry *)&dns);
    de.cname[3].allocsize._4_4_ =
         doh_decode((data_00->req).doh.probe[0].serverdoh.memory,
                    (data_00->req).doh.probe[0].serverdoh.size,(data_00->req).doh.probe[0].dnstype,
                    (dohentry *)&dns);
    (*Curl_cfree)((data_00->req).doh.probe[0].serverdoh.memory);
    if (de.cname[3].allocsize._4_4_ != DOH_OK) {
      pcVar1 = doh_strerror(de.cname[3].allocsize._4_4_);
      pcVar2 = type2name((data_00->req).doh.probe[0].dnstype);
      Curl_infof(data_00,"DOH: %s type %s for %s\n",pcVar1,pcVar2,(data_00->req).doh.host);
    }
    de.cname[3].allocsize._0_4_ =
         doh_decode((data_00->req).doh.probe[1].serverdoh.memory,
                    (data_00->req).doh.probe[1].serverdoh.size,(data_00->req).doh.probe[1].dnstype,
                    (dohentry *)&dns);
    (*Curl_cfree)((data_00->req).doh.probe[1].serverdoh.memory);
    if ((DOHcode)de.cname[3].allocsize != DOH_OK) {
      pcVar1 = doh_strerror((DOHcode)de.cname[3].allocsize);
      pcVar2 = type2name((data_00->req).doh.probe[1].dnstype);
      Curl_infof(data_00,"DOH: %s type %s for %s\n",pcVar1,pcVar2,(data_00->req).doh.host);
    }
    if ((de.cname[3].allocsize._4_4_ == DOH_OK) || ((DOHcode)de.cname[3].allocsize == DOH_OK)) {
      Curl_infof(data_00,"DOH Host name: %s\n",(data_00->req).doh.host);
      showdoh(data_00,(dohentry *)&dns);
      addr = doh2ai((dohentry *)&dns,(data_00->req).doh.host,(data_00->req).doh.port);
      if (addr == (Curl_addrinfo *)0x0) {
        de_cleanup((dohentry *)&dns);
        return CURLE_OUT_OF_MEMORY;
      }
      if (data_00->share != (Curl_share *)0x0) {
        Curl_share_lock(data_00,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
      }
      pCVar3 = Curl_cache_addr(data_00,addr,(data_00->req).doh.host,(data_00->req).doh.port);
      if (data_00->share != (Curl_share *)0x0) {
        Curl_share_unlock(data_00,CURL_LOCK_DATA_DNS);
      }
      de_cleanup((dohentry *)&dns);
      if (pCVar3 != (Curl_dns_entry *)0x0) {
        (conn->async).dns = pCVar3;
        *dnsp = pCVar3;
        return CURLE_OK;
      }
      Curl_freeaddrinfo(addr);
    }
    de_cleanup((dohentry *)&dns);
    conn_local._4_4_ = CURLE_COULDNT_RESOLVE_HOST;
  }
  else {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct connectdata *conn,
                              struct Curl_dns_entry **dnsp)
{
  struct Curl_easy *data = conn->data;
  *dnsp = NULL; /* defaults to no response */

  if(!data->req.doh.probe[0].easy && !data->req.doh.probe[1].easy) {
    failf(data, "Could not DOH-resolve: %s", conn->async.hostname);
    return conn->bits.proxy?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!data->req.doh.pending) {
    DOHcode rc;
    DOHcode rc2;
    struct dohentry de;
    /* remove DOH handles from multi handle and close them */
    curl_multi_remove_handle(data->multi, data->req.doh.probe[0].easy);
    Curl_close(data->req.doh.probe[0].easy);
    curl_multi_remove_handle(data->multi, data->req.doh.probe[1].easy);
    Curl_close(data->req.doh.probe[1].easy);

    /* parse the responses, create the struct and return it! */
    init_dohentry(&de);
    rc = doh_decode(data->req.doh.probe[0].serverdoh.memory,
                    data->req.doh.probe[0].serverdoh.size,
                    data->req.doh.probe[0].dnstype,
                    &de);
    free(data->req.doh.probe[0].serverdoh.memory);
    if(rc) {
      infof(data, "DOH: %s type %s for %s\n", doh_strerror(rc),
            type2name(data->req.doh.probe[0].dnstype),
            data->req.doh.host);
    }
    rc2 = doh_decode(data->req.doh.probe[1].serverdoh.memory,
                     data->req.doh.probe[1].serverdoh.size,
                     data->req.doh.probe[1].dnstype,
                     &de);
    free(data->req.doh.probe[1].serverdoh.memory);
    if(rc2) {
      infof(data, "DOH: %s type %s for %s\n", doh_strerror(rc2),
            type2name(data->req.doh.probe[1].dnstype),
            data->req.doh.host);
    }
    if(!rc || !rc2) {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DOH Host name: %s\n", data->req.doh.host);
      showdoh(data, &de);

      ai = doh2ai(&de, data->req.doh.host, data->req.doh.port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, data->req.doh.host, data->req.doh.port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      de_cleanup(&de);
      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      else {
        conn->async.dns = dns;
        *dnsp = dns;
        return CURLE_OK;
      }
    }
    de_cleanup(&de);

    return CURLE_COULDNT_RESOLVE_HOST;
  }

  return CURLE_OK;
}